

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::on_udp_writeable
          (session_impl *this,weak_ptr<libtorrent::aux::session_udp_socket> *sock,error_code *ec)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar3;
  utp_socket_manager *local_a8;
  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  local_78;
  utp_socket_manager *local_70;
  utp_socket_manager *mgr;
  shared_ptr<libtorrent::aux::session_udp_socket> *local_58;
  shared_ptr<libtorrent::aux::listen_socket_t> *local_50;
  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  local_48;
  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  local_40;
  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  i;
  undefined1 local_30 [8];
  shared_ptr<libtorrent::aux::session_udp_socket> s;
  error_code *ec_local;
  weak_ptr<libtorrent::aux::session_udp_socket> *sock_local;
  session_impl *this_local;
  
  s.super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ec;
  bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
  if (bVar1) {
    return;
  }
  ::std::weak_ptr<libtorrent::aux::session_udp_socket>::lock
            ((weak_ptr<libtorrent::aux::session_udp_socket> *)local_30);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (!bVar1) {
    i._M_current._4_4_ = 1;
    goto LAB_00591316;
  }
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
  peVar2->write_blocked = false;
  local_48._M_current =
       (shared_ptr<libtorrent::aux::listen_socket_t> *)
       ::std::
       vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
       ::begin(&this->m_listen_sockets);
  local_50 = (shared_ptr<libtorrent::aux::listen_socket_t> *)
             ::std::
             vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
             ::end(&this->m_listen_sockets);
  local_58 = (shared_ptr<libtorrent::aux::session_udp_socket> *)local_30;
  local_40 = ::std::
             find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>*,std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>>>>,libtorrent::aux::session_impl::on_udp_writeable(std::weak_ptr<libtorrent::aux::session_udp_socket>,boost::system::error_code_const&)::__0>
                       (local_48,(__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                  )local_50,
                        (shared_ptr<libtorrent::aux::session_udp_socket> *)local_30);
  local_78._M_current =
       (shared_ptr<libtorrent::aux::listen_socket_t> *)
       ::std::
       vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
       ::end(&this->m_listen_sockets);
  bVar1 = __gnu_cxx::operator!=(&local_40,&local_78);
  if (bVar1) {
    this_00 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                 ::operator*(&local_40);
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    if (peVar3->ssl != ssl) goto LAB_005912e8;
    local_a8 = &this->m_ssl_utp_socket_manager;
  }
  else {
LAB_005912e8:
    local_a8 = &this->m_utp_socket_manager;
  }
  local_70 = local_a8;
  aux::utp_socket_manager::writable(local_a8);
  i._M_current._4_4_ = 0;
LAB_00591316:
  ::std::shared_ptr<libtorrent::aux::session_udp_socket>::~shared_ptr
            ((shared_ptr<libtorrent::aux::session_udp_socket> *)local_30);
  return;
}

Assistant:

void session_impl::on_udp_writeable(std::weak_ptr<session_udp_socket> sock, error_code const& ec)
	{
		COMPLETE_ASYNC("session_impl::on_udp_writeable");
		if (ec) return;

		auto s = sock.lock();
		if (!s) return;

		s->write_blocked = false;

#ifdef TORRENT_SSL_PEERS
		auto i = std::find_if(
			m_listen_sockets.begin(), m_listen_sockets.end()
			, [&s] (std::shared_ptr<listen_socket_t> const& ls) { return ls->udp_sock == s; });
#endif

		// notify the utp socket manager it can start sending on the socket again
		struct utp_socket_manager& mgr =
#ifdef TORRENT_SSL_PEERS
			(i != m_listen_sockets.end() && (*i)->ssl == transport::ssl) ? m_ssl_utp_socket_manager :
#endif
			m_utp_socket_manager;

		mgr.writable();
	}